

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O1

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator<<(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *out,
                lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *R)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  wostream *pwVar5;
  char *pcVar6;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar7;
  wchar_t local_2c;
  wchar_t local_28;
  wchar_t local_24;
  
  lVar2 = *(long *)out;
  lVar3 = *(long *)(lVar2 + -0x18);
  uVar1 = *(undefined4 *)(out + lVar3 + 0x18);
  *(undefined4 *)(out + lVar3 + 0x18) = 0x26;
  plVar4 = *(long **)(out + *(long *)(lVar2 + -0x18) + 0xf0);
  if (plVar4 != (long *)0x0) {
    local_2c = (**(code **)(*plVar4 + 0x50))(plVar4,0x5b);
    pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)out,&local_2c,1);
    pcVar6 = lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::name();
    pwVar5 = std::operator<<(pwVar5,pcVar6);
    plVar4 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
    if (plVar4 != (long *)0x0) {
      local_28 = (**(code **)(*plVar4 + 0x50))(plVar4,0x20);
      pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar5,&local_28,1);
      pbVar7 = operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)pwVar5,&R->S);
      plVar4 = *(long **)(pbVar7 + *(long *)(*(long *)pbVar7 + -0x18) + 0xf0);
      if (plVar4 != (long *)0x0) {
        local_24 = (**(code **)(*plVar4 + 0x50))(plVar4,0x5d);
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)pbVar7,&local_24,1);
        *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
        return out;
      }
    }
  }
  std::__throw_bad_cast();
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
        std::basic_ostream<char_t, traits_t> &out, const lagfib4xor &R) {
      std::ios_base::fmtflags flags(out.flags());
      out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      out << '[' << lagfib4xor::name() << ' ' << R.S << ']';
      out.flags(flags);
      return out;
    }